

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O0

void __thiscall
cmTarget::CheckPropertyCompatibility(cmTarget *this,cmComputeLinkInformation *info,string *config)

{
  cmMakefile *this_00;
  bool bVar1;
  int iVar2;
  pointer pIVar3;
  ulong uVar4;
  iterator __first;
  Range<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  *r;
  reference __rhs;
  ostream *poVar5;
  string *psVar6;
  string local_3a0;
  undefined1 local_380 [8];
  ostringstream e;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_208;
  Range<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_1e8;
  undefined1 local_1d8 [8];
  string propsString;
  _Self local_1a8;
  _Base_ptr local_1a0;
  _Self local_198;
  _Base_ptr local_190;
  _Self local_188;
  _Base_ptr local_180;
  _Self local_178;
  _Self local_170;
  const_iterator i;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  props;
  string prop;
  __normal_iterator<const_cmComputeLinkInformation::Item_*,_std::vector<cmComputeLinkInformation::Item,_std::allocator<cmComputeLinkInformation::Item>_>_>
  local_128;
  __normal_iterator<const_cmComputeLinkInformation::Item_*,_std::vector<cmComputeLinkInformation::Item,_std::allocator<cmComputeLinkInformation::Item>_>_>
  local_120;
  const_iterator li;
  undefined1 local_110 [8];
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  emittedMaxNumbers;
  undefined1 local_d8 [8];
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  emittedMinNumbers;
  undefined1 local_a0 [8];
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  emittedStrings;
  allocator local_59;
  undefined1 local_58 [8];
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  emittedBools;
  ItemVector *deps;
  string *config_local;
  cmComputeLinkInformation *info_local;
  cmTarget *this_local;
  
  emittedBools._M_t._M_impl.super__Rb_tree_header._M_node_count =
       (size_t)cmComputeLinkInformation::GetItems(info);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)local_58);
  if ((CheckPropertyCompatibility(cmComputeLinkInformation*,std::__cxx11::string_const&)::
       strBool_abi_cxx11_ == '\0') &&
     (iVar2 = __cxa_guard_acquire(&CheckPropertyCompatibility(cmComputeLinkInformation*,std::__cxx11::string_const&)
                                   ::strBool_abi_cxx11_), iVar2 != 0)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)
               &CheckPropertyCompatibility(cmComputeLinkInformation*,std::__cxx11::string_const&)::
                strBool_abi_cxx11_,"COMPATIBLE_INTERFACE_BOOL",&local_59);
    std::allocator<char>::~allocator((allocator<char> *)&local_59);
    __cxa_atexit(std::__cxx11::string::~string,
                 &CheckPropertyCompatibility(cmComputeLinkInformation*,std::__cxx11::string_const&)
                  ::strBool_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&CheckPropertyCompatibility(cmComputeLinkInformation*,std::__cxx11::string_const&)
                         ::strBool_abi_cxx11_);
  }
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)local_a0);
  if ((CheckPropertyCompatibility(cmComputeLinkInformation*,std::__cxx11::string_const&)::
       strString_abi_cxx11_ == '\0') &&
     (iVar2 = __cxa_guard_acquire(&CheckPropertyCompatibility(cmComputeLinkInformation*,std::__cxx11::string_const&)
                                   ::strString_abi_cxx11_), iVar2 != 0)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)
               &CheckPropertyCompatibility(cmComputeLinkInformation*,std::__cxx11::string_const&)::
                strString_abi_cxx11_,"COMPATIBLE_INTERFACE_STRING",
               (allocator *)
               ((long)&emittedMinNumbers._M_t._M_impl.super__Rb_tree_header._M_node_count + 7));
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&emittedMinNumbers._M_t._M_impl.super__Rb_tree_header._M_node_count + 7));
    __cxa_atexit(std::__cxx11::string::~string,
                 &CheckPropertyCompatibility(cmComputeLinkInformation*,std::__cxx11::string_const&)
                  ::strString_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&CheckPropertyCompatibility(cmComputeLinkInformation*,std::__cxx11::string_const&)
                         ::strString_abi_cxx11_);
  }
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)local_d8);
  if ((CheckPropertyCompatibility(cmComputeLinkInformation*,std::__cxx11::string_const&)::
       strNumMin_abi_cxx11_ == '\0') &&
     (iVar2 = __cxa_guard_acquire(&CheckPropertyCompatibility(cmComputeLinkInformation*,std::__cxx11::string_const&)
                                   ::strNumMin_abi_cxx11_), iVar2 != 0)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)
               &CheckPropertyCompatibility(cmComputeLinkInformation*,std::__cxx11::string_const&)::
                strNumMin_abi_cxx11_,"COMPATIBLE_INTERFACE_NUMBER_MIN",
               (allocator *)
               ((long)&emittedMaxNumbers._M_t._M_impl.super__Rb_tree_header._M_node_count + 7));
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&emittedMaxNumbers._M_t._M_impl.super__Rb_tree_header._M_node_count + 7));
    __cxa_atexit(std::__cxx11::string::~string,
                 &CheckPropertyCompatibility(cmComputeLinkInformation*,std::__cxx11::string_const&)
                  ::strNumMin_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&CheckPropertyCompatibility(cmComputeLinkInformation*,std::__cxx11::string_const&)
                         ::strNumMin_abi_cxx11_);
  }
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)local_110);
  if ((CheckPropertyCompatibility(cmComputeLinkInformation*,std::__cxx11::string_const&)::
       strNumMax_abi_cxx11_ == '\0') &&
     (iVar2 = __cxa_guard_acquire(&CheckPropertyCompatibility(cmComputeLinkInformation*,std::__cxx11::string_const&)
                                   ::strNumMax_abi_cxx11_), iVar2 != 0)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)
               &CheckPropertyCompatibility(cmComputeLinkInformation*,std::__cxx11::string_const&)::
                strNumMax_abi_cxx11_,"COMPATIBLE_INTERFACE_NUMBER_MAX",
               (allocator *)((long)&li._M_current + 7));
    std::allocator<char>::~allocator((allocator<char> *)((long)&li._M_current + 7));
    __cxa_atexit(std::__cxx11::string::~string,
                 &CheckPropertyCompatibility(cmComputeLinkInformation*,std::__cxx11::string_const&)
                  ::strNumMax_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&CheckPropertyCompatibility(cmComputeLinkInformation*,std::__cxx11::string_const&)
                         ::strNumMax_abi_cxx11_);
  }
  local_120._M_current =
       (Item *)std::
               vector<cmComputeLinkInformation::Item,_std::allocator<cmComputeLinkInformation::Item>_>
               ::begin((vector<cmComputeLinkInformation::Item,_std::allocator<cmComputeLinkInformation::Item>_>
                        *)emittedBools._M_t._M_impl.super__Rb_tree_header._M_node_count);
  while( true ) {
    local_128._M_current =
         (Item *)std::
                 vector<cmComputeLinkInformation::Item,_std::allocator<cmComputeLinkInformation::Item>_>
                 ::end((vector<cmComputeLinkInformation::Item,_std::allocator<cmComputeLinkInformation::Item>_>
                        *)emittedBools._M_t._M_impl.super__Rb_tree_header._M_node_count);
    bVar1 = __gnu_cxx::operator!=(&local_120,&local_128);
    if (!bVar1) break;
    pIVar3 = __gnu_cxx::
             __normal_iterator<const_cmComputeLinkInformation::Item_*,_std::vector<cmComputeLinkInformation::Item,_std::allocator<cmComputeLinkInformation::Item>_>_>
             ::operator->(&local_120);
    if (pIVar3->Target != (cmTarget *)0x0) {
      pIVar3 = __gnu_cxx::
               __normal_iterator<const_cmComputeLinkInformation::Item_*,_std::vector<cmComputeLinkInformation::Item,_std::allocator<cmComputeLinkInformation::Item>_>_>
               ::operator->(&local_120);
      checkPropertyConsistency<bool>
                (this,pIVar3->Target,
                 &CheckPropertyCompatibility(cmComputeLinkInformation*,std::__cxx11::string_const&)
                  ::strBool_abi_cxx11_,
                 (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_58,config,BoolType,(bool *)0x0);
      bVar1 = cmSystemTools::GetErrorOccuredFlag();
      if (bVar1) goto LAB_00616bcd;
      pIVar3 = __gnu_cxx::
               __normal_iterator<const_cmComputeLinkInformation::Item_*,_std::vector<cmComputeLinkInformation::Item,_std::allocator<cmComputeLinkInformation::Item>_>_>
               ::operator->(&local_120);
      checkPropertyConsistency<char_const*>
                (this,pIVar3->Target,
                 &CheckPropertyCompatibility(cmComputeLinkInformation*,std::__cxx11::string_const&)
                  ::strString_abi_cxx11_,
                 (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_a0,config,StringType,(char **)0x0);
      bVar1 = cmSystemTools::GetErrorOccuredFlag();
      if (bVar1) goto LAB_00616bcd;
      pIVar3 = __gnu_cxx::
               __normal_iterator<const_cmComputeLinkInformation::Item_*,_std::vector<cmComputeLinkInformation::Item,_std::allocator<cmComputeLinkInformation::Item>_>_>
               ::operator->(&local_120);
      checkPropertyConsistency<char_const*>
                (this,pIVar3->Target,
                 &CheckPropertyCompatibility(cmComputeLinkInformation*,std::__cxx11::string_const&)
                  ::strNumMin_abi_cxx11_,
                 (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_d8,config,NumberMinType,(char **)0x0);
      bVar1 = cmSystemTools::GetErrorOccuredFlag();
      if (bVar1) goto LAB_00616bcd;
      pIVar3 = __gnu_cxx::
               __normal_iterator<const_cmComputeLinkInformation::Item_*,_std::vector<cmComputeLinkInformation::Item,_std::allocator<cmComputeLinkInformation::Item>_>_>
               ::operator->(&local_120);
      checkPropertyConsistency<char_const*>
                (this,pIVar3->Target,
                 &CheckPropertyCompatibility(cmComputeLinkInformation*,std::__cxx11::string_const&)
                  ::strNumMax_abi_cxx11_,
                 (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_110,config,NumberMaxType,(char **)0x0);
      bVar1 = cmSystemTools::GetErrorOccuredFlag();
      if (bVar1) goto LAB_00616bcd;
    }
    __gnu_cxx::
    __normal_iterator<const_cmComputeLinkInformation::Item_*,_std::vector<cmComputeLinkInformation::Item,_std::allocator<cmComputeLinkInformation::Item>_>_>
    ::operator++(&local_120);
  }
  intersect((string *)
            &props.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage,
            (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_58,
            (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_a0,
            (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_d8,
            (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_110);
  uVar4 = std::__cxx11::string::empty();
  if ((uVar4 & 1) == 0) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&i);
    local_170._M_node =
         (_Base_ptr)
         std::
         set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::find((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_58,
                (key_type *)
                &props.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
    local_178._M_node =
         (_Base_ptr)
         std::
         set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_58);
    bVar1 = std::operator!=(&local_170,&local_178);
    if (bVar1) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&i,&CheckPropertyCompatibility(cmComputeLinkInformation*,std::__cxx11::string_const&)
                         ::strBool_abi_cxx11_);
    }
    local_180 = (_Base_ptr)
                std::
                set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::find((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_a0,
                       (key_type *)
                       &props.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
    local_170._M_node = local_180;
    local_188._M_node =
         (_Base_ptr)
         std::
         set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_a0);
    bVar1 = std::operator!=(&local_170,&local_188);
    if (bVar1) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&i,&CheckPropertyCompatibility(cmComputeLinkInformation*,std::__cxx11::string_const&)
                         ::strString_abi_cxx11_);
    }
    local_190 = (_Base_ptr)
                std::
                set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::find((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_d8,
                       (key_type *)
                       &props.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
    local_170._M_node = local_190;
    local_198._M_node =
         (_Base_ptr)
         std::
         set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_d8);
    bVar1 = std::operator!=(&local_170,&local_198);
    if (bVar1) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&i,&CheckPropertyCompatibility(cmComputeLinkInformation*,std::__cxx11::string_const&)
                         ::strNumMin_abi_cxx11_);
    }
    local_1a0 = (_Base_ptr)
                std::
                set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::find((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_110,
                       (key_type *)
                       &props.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
    local_170._M_node = local_1a0;
    local_1a8._M_node =
         (_Base_ptr)
         std::
         set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_110);
    bVar1 = std::operator!=(&local_170,&local_1a8);
    if (bVar1) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&i,&CheckPropertyCompatibility(cmComputeLinkInformation*,std::__cxx11::string_const&)
                         ::strNumMax_abi_cxx11_);
    }
    __first = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&i);
    propsString.field_2._8_8_ =
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&i);
    std::
    sort<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
              ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                )__first._M_current,
               (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                )propsString.field_2._8_8_);
    local_1e8 = cmRange<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                          ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)&i);
    r = ContainerAlgorithms::
        Range<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        ::retreat(&local_1e8,1);
    cmJoin<ContainerAlgorithms::Range<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>
              ((string *)local_1d8,r,", ");
    __rhs = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&i);
    std::operator+(&local_208," and the ",__rhs);
    std::__cxx11::string::operator+=((string *)local_1d8,(string *)&local_208);
    std::__cxx11::string::~string((string *)&local_208);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_380);
    poVar5 = std::operator<<((ostream *)local_380,"Property \"");
    poVar5 = std::operator<<(poVar5,(string *)
                                    &props.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
    poVar5 = std::operator<<(poVar5,"\" appears in both the ");
    poVar5 = std::operator<<(poVar5,(string *)local_1d8);
    poVar5 = std::operator<<(poVar5," property in the dependencies of target \"");
    psVar6 = GetName_abi_cxx11_(this);
    poVar5 = std::operator<<(poVar5,(string *)psVar6);
    std::operator<<(poVar5,
                    "\".  This is not allowed. A property may only require compatibility in a boolean interpretation, a numeric minimum, a numeric maximum or a string interpretation, but not a mixture."
                   );
    this_00 = this->Makefile;
    std::__cxx11::ostringstream::str();
    cmMakefile::IssueMessage(this_00,FATAL_ERROR,&local_3a0);
    std::__cxx11::string::~string((string *)&local_3a0);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_380);
    std::__cxx11::string::~string((string *)local_1d8);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&i);
  }
  std::__cxx11::string::~string
            ((string *)
             &props.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
LAB_00616bcd:
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)local_110);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)local_d8);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)local_a0);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)local_58);
  return;
}

Assistant:

void cmTarget::CheckPropertyCompatibility(cmComputeLinkInformation *info,
                                          const std::string& config) const
{
  const cmComputeLinkInformation::ItemVector &deps = info->GetItems();

  std::set<std::string> emittedBools;
  static std::string strBool = "COMPATIBLE_INTERFACE_BOOL";
  std::set<std::string> emittedStrings;
  static std::string strString = "COMPATIBLE_INTERFACE_STRING";
  std::set<std::string> emittedMinNumbers;
  static std::string strNumMin = "COMPATIBLE_INTERFACE_NUMBER_MIN";
  std::set<std::string> emittedMaxNumbers;
  static std::string strNumMax = "COMPATIBLE_INTERFACE_NUMBER_MAX";

  for(cmComputeLinkInformation::ItemVector::const_iterator li =
      deps.begin();
      li != deps.end(); ++li)
    {
    if (!li->Target)
      {
      continue;
      }

    checkPropertyConsistency<bool>(this, li->Target,
                                strBool,
                                emittedBools, config, BoolType, 0);
    if (cmSystemTools::GetErrorOccuredFlag())
      {
      return;
      }
    checkPropertyConsistency<const char *>(this, li->Target,
                                strString,
                                emittedStrings, config,
                                StringType, 0);
    if (cmSystemTools::GetErrorOccuredFlag())
      {
      return;
      }
    checkPropertyConsistency<const char *>(this, li->Target,
                                strNumMin,
                                emittedMinNumbers, config,
                                NumberMinType, 0);
    if (cmSystemTools::GetErrorOccuredFlag())
      {
      return;
      }
    checkPropertyConsistency<const char *>(this, li->Target,
                                strNumMax,
                                emittedMaxNumbers, config,
                                NumberMaxType, 0);
    if (cmSystemTools::GetErrorOccuredFlag())
      {
      return;
      }
    }

  std::string prop = intersect(emittedBools,
                               emittedStrings,
                               emittedMinNumbers,
                               emittedMaxNumbers);

  if (!prop.empty())
    {
    // Use a sorted std::vector to keep the error message sorted.
    std::vector<std::string> props;
    std::set<std::string>::const_iterator i = emittedBools.find(prop);
    if (i != emittedBools.end())
      {
      props.push_back(strBool);
      }
    i = emittedStrings.find(prop);
    if (i != emittedStrings.end())
      {
      props.push_back(strString);
      }
    i = emittedMinNumbers.find(prop);
    if (i != emittedMinNumbers.end())
      {
      props.push_back(strNumMin);
      }
    i = emittedMaxNumbers.find(prop);
    if (i != emittedMaxNumbers.end())
      {
      props.push_back(strNumMax);
      }
    std::sort(props.begin(), props.end());

    std::string propsString = cmJoin(cmRange(props).retreat(1), ", ");
    propsString += " and the " + props.back();

    std::ostringstream e;
    e << "Property \"" << prop << "\" appears in both the "
      << propsString <<
    " property in the dependencies of target \"" << this->GetName() <<
    "\".  This is not allowed. A property may only require compatibility "
    "in a boolean interpretation, a numeric minimum, a numeric maximum or a "
    "string interpretation, but not a mixture.";
    this->Makefile->IssueMessage(cmake::FATAL_ERROR, e.str());
    }
}